

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::Miner::onRequest(Miner *this,IApiRequest *request)

{
  bool bVar1;
  int iVar2;
  reference ppIVar3;
  MinerPrivate *in_RSI;
  long in_RDI;
  IBackend *backend;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range1;
  int in_stack_0000009c;
  Document *in_stack_000000a0;
  Value *in_stack_000000a8;
  MinerPrivate *in_stack_000000b0;
  int in_stack_0000014c;
  Document *in_stack_00000150;
  Value *in_stack_00000158;
  MinerPrivate *in_stack_00000160;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *in_stack_ffffffffffffff88;
  Miner *in_stack_ffffffffffffff90;
  Miner *in_stack_ffffffffffffffb0;
  __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  in_stack_ffffffffffffffe0;
  Value *in_stack_ffffffffffffffe8;
  
  iVar2 = (**(code **)(*(long *)in_RSI + 0x58))();
  if (iVar2 == 1) {
    iVar2 = (**(code **)(*(long *)in_RSI + 0x70))();
    if (iVar2 == 1) {
      (**(code **)(*(long *)in_RSI + 0x10))();
      (**(code **)(*(long *)in_RSI + 0x68))();
      (**(code **)(*(long *)in_RSI + 0x60))();
      (**(code **)(*(long *)in_RSI + 0x50))();
      MinerPrivate::getMiner
                (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009c);
      (**(code **)(*(long *)in_RSI + 0x68))();
      (**(code **)(*(long *)in_RSI + 0x60))();
      (**(code **)(*(long *)in_RSI + 0x50))();
      MinerPrivate::getHashrate
                (in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_0000014c);
    }
    else {
      (**(code **)(*(long *)in_RSI + 0x48))();
      bVar1 = String::operator==((String *)in_stack_ffffffffffffff90,
                                 (char *)in_stack_ffffffffffffff88);
      if (bVar1) {
        (**(code **)(*(long *)in_RSI + 0x10))();
        in_stack_ffffffffffffff88 =
             *(vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> **)(in_RDI + 0x18);
        in_stack_ffffffffffffff90 = (Miner *)(**(code **)(*(long *)in_RSI + 0x68))();
        (**(code **)(*(long *)in_RSI + 0x60))();
        MinerPrivate::getBackends
                  (in_RSI,in_stack_ffffffffffffffe8,(Document *)in_stack_ffffffffffffffe0._M_current
                  );
      }
    }
  }
  else {
    iVar2 = (**(code **)(*(long *)in_RSI + 0x70))();
    if (iVar2 == 2) {
      (**(code **)(*(long *)in_RSI + 0x40))();
      bVar1 = String::operator==((String *)in_stack_ffffffffffffff90,
                                 (char *)in_stack_ffffffffffffff88);
      if (bVar1) {
        (**(code **)(*(long *)in_RSI + 0x10))();
        setEnabled(in_stack_ffffffffffffff90,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
      }
      else {
        (**(code **)(*(long *)in_RSI + 0x40))();
        bVar1 = String::operator==((String *)in_stack_ffffffffffffff90,
                                   (char *)in_stack_ffffffffffffff88);
        if (bVar1) {
          (**(code **)(*(long *)in_RSI + 0x10))();
          setEnabled(in_stack_ffffffffffffff90,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
        }
        else {
          (**(code **)(*(long *)in_RSI + 0x40))();
          bVar1 = String::operator==((String *)in_stack_ffffffffffffff90,
                                     (char *)in_stack_ffffffffffffff88);
          if (bVar1) {
            (**(code **)(*(long *)in_RSI + 0x10))();
            stop(in_stack_ffffffffffffffb0);
          }
        }
      }
    }
  }
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
            (in_stack_ffffffffffffff88);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end(in_stack_ffffffffffffff88)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    ppIVar3 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*((__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                           *)&stack0xffffffffffffffe0);
    (*(*ppIVar3)->_vptr_IBackend[0xe])(*ppIVar3,in_RSI);
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++((__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void xmrig::Miner::onRequest(IApiRequest &request)
{
    if (request.method() == IApiRequest::METHOD_GET) {
        if (request.type() == IApiRequest::REQ_SUMMARY) {
            request.accept();

            d_ptr->getMiner(request.reply(), request.doc(), request.version());
            d_ptr->getHashrate(request.reply(), request.doc(), request.version());
        }
        else if (request.url() == "/2/backends") {
            request.accept();

            d_ptr->getBackends(request.reply(), request.doc());
        }
    }
    else if (request.type() == IApiRequest::REQ_JSON_RPC) {
        if (request.rpcMethod() == "pause") {
            request.accept();

            setEnabled(false);
        }
        else if (request.rpcMethod() == "resume") {
            request.accept();

            setEnabled(true);
        }
        else if (request.rpcMethod() == "stop") {
            request.accept();

            stop();
        }
    }

    for (IBackend *backend : d_ptr->backends) {
        backend->handleRequest(request);
    }
}